

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_savetext(_binbuf *bfrom,_binbuf *bto)

{
  char *pcVar1;
  char *pcVar2;
  t_atom *argv;
  ulong uVar3;
  t_atom *a;
  bool bVar4;
  t_atom at;
  char buf [1001];
  
  a = bfrom->b_vec;
  uVar3 = 0;
  if (0 < bfrom->b_n) {
    uVar3 = (ulong)(uint)bfrom->b_n;
  }
  do {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      binbuf_addsemi(bto);
      return;
    }
    argv = a;
    if (a->a_type != A_FLOAT) {
      if (a->a_type == A_SYMBOL) {
        pcVar2 = ((a->a_w).w_symbol)->s_name;
        pcVar1 = strchr(pcVar2,0x3b);
        if (((pcVar1 == (char *)0x0) && (pcVar1 = strchr(pcVar2,0x2c), pcVar1 == (char *)0x0)) &&
           (pcVar2 = strchr(pcVar2,0x24), pcVar2 == (char *)0x0)) goto LAB_00165b2c;
      }
      atom_string(a,buf,1000);
      at.a_type = A_SYMBOL;
      at.a_w.w_symbol = gensym(buf);
      argv = &at;
    }
LAB_00165b2c:
    binbuf_add(bto,1,argv);
    a = a + 1;
  } while( true );
}

Assistant:

void binbuf_savetext(const t_binbuf *bfrom, t_binbuf *bto)
{
    int k, n = binbuf_getnatom(bfrom);
    const t_atom *ap = binbuf_getvec(bfrom);
    t_atom at;
    for (k = 0; k < n; k++)
    {
        if (ap[k].a_type == A_FLOAT ||
            (ap[k].a_type == A_SYMBOL &&
                !strchr(ap[k].a_w.w_symbol->s_name, ';') &&
                !strchr(ap[k].a_w.w_symbol->s_name, ',') &&
                !strchr(ap[k].a_w.w_symbol->s_name, '$')))
                    binbuf_add(bto, 1, &ap[k]);
        else
        {
            char buf[MAXPDSTRING+1];
            atom_string(&ap[k], buf, MAXPDSTRING);
            SETSYMBOL(&at, gensym(buf));
            binbuf_add(bto, 1, &at);
        }
    }
    binbuf_addsemi(bto);
}